

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_api_v2.c
# Opt level: O0

MPP_RET hal_av1d_deinit(void *hal)

{
  Av1dHalCtx *p_hal;
  MPP_RET ret;
  void *hal_local;
  
  p_hal._4_4_ = (**(code **)(*hal + 0x20))(hal);
  if (p_hal._4_4_ < MPP_OK) {
    if ((hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_api","Function error(%d).\n",(char *)0x0,0x6b);
    }
  }
  else {
    if (*(long *)((long)hal + 0x48) != 0) {
      mpp_dev_deinit(*(MppDev *)((long)hal + 0x48));
      *(undefined8 *)((long)hal + 0x48) = 0;
    }
    if ((*(long *)((long)hal + 0x38) == 0) ||
       (p_hal._4_4_ = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x38)),
       MPP_NOK < p_hal._4_4_)) {
      return MPP_OK;
    }
    if ((hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_api","Function error(%d).\n",(char *)0x0,0x73);
    }
  }
  return p_hal._4_4_;
}

Assistant:

MPP_RET hal_av1d_deinit(void *hal)
{
    MPP_RET ret         = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal   = (Av1dHalCtx *)hal;

    FUN_CHECK(ret = p_hal->api->deinit(hal));

    if (p_hal->dev) {
        mpp_dev_deinit(p_hal->dev);
        p_hal->dev = NULL;
    }

    if (p_hal->buf_group) {
        FUN_CHECK(ret = mpp_buffer_group_put(p_hal->buf_group));
    }

    return MPP_OK;
__FAILED:
    return ret;
}